

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

NeuralNetwork *
buildBasicNeuralNetworkModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr,
          int numberOfLayers,bool areWeightsQuantized,bool isBiasQuantized)

{
  Rep *pRVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  string *psVar7;
  InnerProductLayerParams *this_00;
  WeightParams *pWVar8;
  QuantizationParams *pQVar9;
  LinearQuantizationParams *pLVar10;
  int i;
  int iVar11;
  char *value;
  int __val;
  long lVar12;
  void **ppvVar13;
  string output;
  string input;
  string layerName;
  string local_50;
  
  pMVar2 = CoreML::Specification::Model::mutable_description(m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,inTensorAttr->name);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  for (iVar11 = 0; iVar11 < inTensorAttr->dimension; iVar11 = iVar11 + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  }
  pMVar2 = CoreML::Specification::Model::mutable_description(m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,outTensorAttr->name);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  for (iVar11 = 0; iVar11 < outTensorAttr->dimension; iVar11 = iVar11 + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  }
  m->specificationversion_ = 4;
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(m);
  __val = 0;
  iVar11 = 0;
  if (0 < numberOfLayers) {
    iVar11 = numberOfLayers;
  }
  while( true ) {
    if (iVar11 == 0) break;
    this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar6->layers_);
    std::__cxx11::to_string(&input,__val);
    std::operator+(&layerName,"inner_layer",&input);
    std::__cxx11::string::~string((string *)&input);
    std::__cxx11::to_string(&output,__val + -1);
    std::operator+(&input,"output",&output);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::to_string(&local_50,__val);
    std::operator+(&output,"output",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    value = "inner_layer";
    if (numberOfLayers != 1) {
      value = (char *)layerName._M_dataplus;
    }
    CoreML::Specification::NeuralNetworkLayer::set_name(this,value);
    psVar7 = &input;
    if (__val == 0) {
      psVar7 = (string *)inTensorAttr;
    }
    CoreML::Specification::NeuralNetworkLayer::add_input(this,(psVar7->_M_dataplus)._M_p);
    psVar7 = &output;
    if (__val == numberOfLayers + -1) {
      psVar7 = (string *)outTensorAttr;
    }
    CoreML::Specification::NeuralNetworkLayer::add_output(this,(psVar7->_M_dataplus)._M_p);
    this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this);
    this_00->inputchannels_ = 1;
    this_00->outputchannels_ = 1;
    pWVar8 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
    if (areWeightsQuantized) {
      pQVar9 = CoreML::Specification::WeightParams::mutable_quantization(pWVar8);
      pQVar9->numberofbits_ = 1;
      pLVar10 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar9);
      CoreML::Specification::LinearQuantizationParams::add_scale(pLVar10,1.0);
      CoreML::Specification::LinearQuantizationParams::add_bias(pLVar10,0.0);
      CoreML::Specification::WeightParams::set_int8rawvalue(pWVar8,"x01");
    }
    else {
      CoreML::Specification::WeightParams::add_floatvalue(pWVar8,1.0);
    }
    this_00->hasbias_ = true;
    pWVar8 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
    if (isBiasQuantized) {
      pQVar9 = CoreML::Specification::WeightParams::mutable_quantization(pWVar8);
      pQVar9->numberofbits_ = 1;
      pLVar10 = CoreML::Specification::QuantizationParams::mutable_linearquantization(pQVar9);
      CoreML::Specification::LinearQuantizationParams::add_scale(pLVar10,1.0);
      CoreML::Specification::LinearQuantizationParams::add_bias(pLVar10,0.0);
      CoreML::Specification::WeightParams::set_int8rawvalue(pWVar8,"x01");
    }
    else {
      CoreML::Specification::WeightParams::add_floatvalue(pWVar8,1.0);
    }
    if (isUpdatable) {
      this->isupdatable_ = true;
      pWVar8 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_00);
      pWVar8->isupdatable_ = true;
      pWVar8 = CoreML::Specification::InnerProductLayerParams::mutable_bias(this_00);
      pWVar8->isupdatable_ = true;
    }
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&input);
    std::__cxx11::string::~string((string *)&layerName);
    __val = __val + 1;
    iVar11 = iVar11 + -1;
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
    pMVar2 = m->description_;
    if (pMVar2 == (ModelDescription *)0x0) {
      pMVar2 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar1 = (pMVar2->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar13 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      ppvVar13 = (void **)0x0;
    }
    iVar11 = (pMVar2->input_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar12 = 0; (long)iVar11 * 8 != lVar12; lVar12 = lVar12 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&layerName,*(FeatureDescription **)((long)ppvVar13 + lVar12))
      ;
      pMVar2 = CoreML::Specification::Model::mutable_description(m);
      pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                         (&pMVar2->traininginput_);
      CoreML::Specification::FeatureDescription::CopyFrom(pFVar3,(FeatureDescription *)&layerName);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&layerName);
    }
  }
  return pNVar6;
}

Assistant:

Specification::NeuralNetwork* buildBasicNeuralNetworkModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, int numberOfLayers, bool areWeightsQuantized, bool isBiasQuantized) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto neuralNet = m.mutable_neuralnetwork();
    
    for (int i = 0; i < numberOfLayers; i++) {
        auto layer = neuralNet->add_layers();
        
        std::string layerName = "inner_layer" + std::to_string(i);
        std::string input = "output" + std::to_string(i-1);
        std::string output = "output" + std::to_string(i);
        
        layer->set_name((numberOfLayers == 1) ? "inner_layer" : layerName.c_str());
        layer->add_input((i == 0) ? inTensorAttr->name : input.c_str());
        layer->add_output((i == numberOfLayers-1) ? outTensorAttr->name : output.c_str());
        
        Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
        innerProductParams->set_inputchannels(1);
        innerProductParams->set_outputchannels(1);

        // set weight
        auto* weights = innerProductParams->mutable_weights();
        if (areWeightsQuantized) {
            auto *quant_params = weights->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            weights->set_int8rawvalue("x01"); // this is [1]
        } else {
            weights->add_floatvalue(1.0);
        }

        // set bias
        innerProductParams->set_hasbias(true);
        auto* bias = innerProductParams->mutable_bias();
        if (isBiasQuantized) {
            auto *quant_params = bias->mutable_quantization();
            quant_params->set_numberofbits(1);
            auto *linear_quant_params = quant_params->mutable_linearquantization();
            linear_quant_params->add_scale(1.0f);
            linear_quant_params->add_bias(0.0f);
            bias->set_int8rawvalue("x01"); // this is [1]
        } else {
            bias->add_floatvalue(1.0);
        }
        
        if (isUpdatable) {
            layer->set_isupdatable(true);
            innerProductParams->mutable_weights()->set_isupdatable(true);
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
    }
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
    }
    
    return neuralNet;
}